

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

bool __thiscall
CLOParser::getOption<int>(CLOParser *this,char *names,int *pResult,bool fValueOptional)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long *plVar4;
  int tmp;
  string arg;
  string keyword;
  istringstream iss_1;
  istringstream iss;
  
  if (*this->i < this->argc) {
    std::__cxx11::string::string((string *)&arg,this->argv[*this->i],(allocator *)&iss);
    keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
    keyword._M_string_length = 0;
    keyword.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&iss_1,names,(allocator *)&tmp);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&iss_1,_S_in);
    std::__cxx11::string::~string((string *)&iss_1);
    do {
      do {
        piVar3 = std::operator>>((istream *)&iss,(string *)&keyword);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          fValueOptional = false;
          goto LAB_00199aa3;
        }
      } while (((pResult == (int *)0x0 || 2 < keyword._M_string_length) &&
               (bVar1 = std::operator!=(&arg,&keyword), bVar1)) ||
              (iVar2 = std::__cxx11::string::compare
                                 ((ulong)&arg,0,(string *)keyword._M_string_length), iVar2 != 0));
      if (arg._M_string_length <= keyword._M_string_length) {
        if (pResult == (int *)0x0) {
          fValueOptional = true;
          goto LAB_00199aa3;
        }
        iVar2 = *this->i + 1;
        *this->i = iVar2;
        if (this->argc <= iVar2) goto LAB_00199aa3;
        std::__cxx11::string::assign((char *)&arg);
        goto LAB_00199a56;
      }
    } while (pResult == (int *)0x0);
    std::__cxx11::string::erase((ulong)&arg,0);
LAB_00199a56:
    std::__cxx11::istringstream::istringstream((istringstream *)&iss_1,(string *)&arg,_S_in);
    plVar4 = (long *)std::istream::operator>>((istream *)&iss_1,&tmp);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      *pResult = tmp;
      fValueOptional = true;
    }
    else {
      *this->i = *this->i + -1;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss_1);
LAB_00199aa3:
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    std::__cxx11::string::~string((string *)&keyword);
    std::__cxx11::string::~string((string *)&arg);
  }
  else {
    fValueOptional = false;
  }
  return fValueOptional;
}

Assistant:

inline bool getOption(const char* names,           // space-separated option list
												Value* pResult = nullptr,    // pointer to value storage
												bool fValueOptional = false  // if pResult, for non-string values
	) {
		assert(nullptr == strchr(names, ','));
		assert(nullptr == strchr(names, ';'));
		if (i >= argc) {
			return false;
		}
		assert(argv[i]);
		std::string arg(argv[i]);
		/// Separate keywords
		std::string keyword;
		std::istringstream iss(names);
		while (iss >> keyword) {
			if (((2 < keyword.size() || nullptr == pResult) && arg != keyword) ||  // exact cmp
					(0 != arg.compare(0, keyword.size(), keyword))) {                  // truncated cmp
				continue;
			}
			/// Process it
			if (keyword.size() < arg.size()) {
				if (nullptr == pResult) {
					continue;
				}
				arg.erase(0, keyword.size());
			} else {
				if (nullptr == pResult) {
					return true;
				}
				i++;
				if (i >= argc) {
					return fValueOptional;
				}
				arg = argv[i];
			}
			assert(pResult);
			if (assignStr(pResult, arg)) {
				return true;
			}
			std::istringstream iss(arg);  // NOLINT
			Value tmp;
			if (!(iss >> tmp)) {
				--i;
				if (fValueOptional) {
					return true;
				}
				// Not print because another agent can handle this option
				//           cerr << "\nBad value for " << keyword << ": " << arg << endl;
				return false;
			}
			*pResult = tmp;
			return true;
		}
		return false;
	}